

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

void __thiscall
helics::TimeCoordinator::sendUpdatedExecRequest
          (TimeCoordinator *this,GlobalFederateId target,GlobalFederateId minFed,
          int32_t responseSequenceCounter)

{
  pointer pDVar1;
  DependencyInfo *pDVar2;
  pointer pDVar3;
  ActionMessage execreq;
  ActionMessage AStack_e8;
  
  if ((minFed.gid == -1700000000) || (minFed.gid == -2010000000)) {
    pDVar2 = getExecEntryMinFederate
                       (&(this->super_BaseTimeCoordinator).dependencies,
                        (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,NONE,
                        (GlobalFederateId)0x8831d580);
    responseSequenceCounter = (pDVar2->super_TimeData).sequenceCounter;
    minFed.gid = (pDVar2->fedID).gid;
  }
  ActionMessage::ActionMessage(&AStack_e8,cmd_exec_request);
  AStack_e8.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
  setIterationFlags(&AStack_e8,this->iterating);
  AStack_e8.counter = (uint16_t)(this->super_BaseTimeCoordinator).sequenceCounter;
  AStack_e8.messageID = (int32_t)this->currentRestrictionLevel;
  if ((this->info).wait_for_current_time_updates == true) {
    AStack_e8.flags._1_1_ = AStack_e8.flags._1_1_ | 4;
  }
  AStack_e8.dest_handle.hid = minFed.gid;
  if ((target.gid == -2010000000) || (target.gid == -1700000000)) {
    pDVar3 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pDVar1 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pDVar3 != pDVar1) {
      do {
        if ((pDVar3->dependent == true) && ((pDVar3->super_TimeData).mTimeState < time_granted)) {
          AStack_e8.dest_id.gid = (pDVar3->fedID).gid;
          AStack_e8.source_handle.hid = (pDVar3->super_TimeData).sequenceCounter;
          if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager
              == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                    ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&AStack_e8)
          ;
        }
        pDVar3 = pDVar3 + 1;
      } while (pDVar3 != pDVar1);
    }
  }
  else {
    AStack_e8.source_handle.hid = responseSequenceCounter;
    AStack_e8.dest_id.gid = target.gid;
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
              ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&AStack_e8);
  }
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void TimeCoordinator::sendUpdatedExecRequest(GlobalFederateId target,
                                             GlobalFederateId minFed,
                                             std::int32_t responseSequenceCounter)
{
    if (!minFed.isValid()) {
        const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
        minFed = mfed.fedID;
        responseSequenceCounter = mfed.sequenceCounter;
    }

    ActionMessage execreq(CMD_EXEC_REQUEST);
    execreq.source_id = mSourceId;
    setIterationFlags(execreq, iterating);
    execreq.counter = sequenceCounter;
    execreq.setExtraData(minFed.baseValue());

    execreq.messageID = currentRestrictionLevel;
    if (info.wait_for_current_time_updates) {
        setActionFlag(execreq, delayed_timing_flag);
    }
    if (target.isValid()) {
        execreq.dest_id = target;
        execreq.setExtraDestData(responseSequenceCounter);
        sendMessageFunction(execreq);
    } else {
        for (const auto& dep : dependencies) {
            if (dep.dependent && dep.mTimeState < TimeState::time_granted) {
                execreq.dest_id = dep.fedID;
                execreq.setExtraDestData(dep.sequenceCounter);
                sendMessageFunction(execreq);
            }
        }
    }
}